

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::CheckRequiredCapabilities
          (ValidationState_t *state,Instruction *inst,size_t which_operand,
          spv_parsed_operand_t *operand,uint32_t word)

{
  bool bVar1;
  Op OVar2;
  AssemblyGrammar *pAVar3;
  Feature *pFVar4;
  spv_const_context psVar5;
  DiagnosticStream *pDVar6;
  AssemblyGrammar *capabilities;
  string local_330;
  char *local_310;
  DiagnosticStream local_308;
  byte local_129;
  undefined1 local_128 [7];
  bool enabled_by_cap;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_108;
  Capability local_e4;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_e0;
  Capability local_bc;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_b8;
  Capability local_94;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_90;
  Capability local_6c [3];
  spv_operand_desc_t *psStack_60;
  spv_result_t lookup_result;
  spv_operand_desc operand_desc;
  CapabilitySet enabling_capabilities;
  uint32_t word_local;
  spv_parsed_operand_t *operand_local;
  size_t which_operand_local;
  Instruction *inst_local;
  ValidationState_t *state_local;
  
  enabling_capabilities.size_._4_4_ = word;
  operand_local = (spv_parsed_operand_t *)which_operand;
  which_operand_local = (size_t)inst;
  inst_local = (Instruction *)state;
  if (operand->type == SPV_OPERAND_TYPE_BUILT_IN) {
    if ((word == 1) || (word == 3 || word == 4)) {
      return SPV_SUCCESS;
    }
  }
  else if (operand->type == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    pFVar4 = ValidationState_t::features(state);
    if ((pFVar4->free_fp_rounding_mode & 1U) != 0) {
      return SPV_SUCCESS;
    }
  }
  else if (((operand->type == SPV_OPERAND_TYPE_GROUP_OPERATION) &&
           (pFVar4 = ValidationState_t::features(state),
           (pFVar4->group_ops_reduce_and_scans & 1U) != 0)) &&
          (enabling_capabilities.size_._4_4_ < 3)) {
    return SPV_SUCCESS;
  }
  EnumSet<spv::Capability>::EnumSet((EnumSet<spv::Capability> *)&operand_desc);
  psStack_60 = (spv_operand_desc_t *)0x0;
  pAVar3 = ValidationState_t::grammar((ValidationState_t *)inst_local);
  local_6c[2] = AssemblyGrammar::lookupOperand
                          (pAVar3,operand->type,enabling_capabilities.size_._4_4_,
                           &stack0xffffffffffffffa0);
  if (local_6c[2] == SPV_SUCCESS) {
    if ((operand->type == SPV_OPERAND_TYPE_DECORATION) && (psStack_60->value == 0x27)) {
      pFVar4 = ValidationState_t::features((ValidationState_t *)inst_local);
      if ((pFVar4->free_fp_rounding_mode & 1U) != 0) {
        state_local._4_4_ = SPV_SUCCESS;
        goto LAB_002ca066;
      }
      psVar5 = ValidationState_t::context((ValidationState_t *)inst_local);
      bVar1 = spvIsVulkanEnv(psVar5->target_env);
      if (bVar1) {
        local_6c[0] = CapabilityStorageBuffer16BitAccess;
        EnumSet<spv::Capability>::insert
                  (&local_90,(EnumSet<spv::Capability> *)&operand_desc,local_6c);
        local_94 = CapabilityStorageUniform16;
        EnumSet<spv::Capability>::insert
                  (&local_b8,(EnumSet<spv::Capability> *)&operand_desc,&local_94);
        local_bc = CapabilityStoragePushConstant16;
        EnumSet<spv::Capability>::insert
                  (&local_e0,(EnumSet<spv::Capability> *)&operand_desc,&local_bc);
        local_e4 = CapabilityStorageInputOutput16;
        EnumSet<spv::Capability>::insert
                  (&local_108,(EnumSet<spv::Capability> *)&operand_desc,&local_e4);
      }
    }
    else {
      pAVar3 = ValidationState_t::grammar((ValidationState_t *)inst_local);
      AssemblyGrammar::filterCapsAgainstTargetEnv
                ((CapabilitySet *)local_128,pAVar3,psStack_60->capabilities,
                 psStack_60->numCapabilities);
      EnumSet<spv::Capability>::operator=
                ((EnumSet<spv::Capability> *)&operand_desc,(EnumSet<spv::Capability> *)local_128);
      EnumSet<spv::Capability>::~EnumSet((EnumSet<spv::Capability> *)local_128);
    }
    OVar2 = Instruction::opcode((Instruction *)which_operand_local);
    if (OVar2 != OpCapability) {
      local_129 = ValidationState_t::HasAnyOfCapabilities
                            ((ValidationState_t *)inst_local,(CapabilitySet *)&operand_desc);
      bVar1 = EnumSet<spv::Capability>::empty((EnumSet<spv::Capability> *)&operand_desc);
      if ((!bVar1) && ((local_129 & 1) == 0)) {
        pAVar3 = (AssemblyGrammar *)which_operand_local;
        ValidationState_t::diag
                  (&local_308,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_CAPABILITY,
                   (Instruction *)which_operand_local);
        pDVar6 = DiagnosticStream::operator<<(&local_308,(char (*) [9])"Operand ");
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(unsigned_long *)&operand_local);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [5])0x64ca56);
        OVar2 = Instruction::opcode((Instruction *)which_operand_local);
        local_310 = spvOpcodeString(OVar2);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_310);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [38])" requires one of these capabilities: ");
        capabilities = ValidationState_t::grammar((ValidationState_t *)inst_local);
        (anonymous_namespace)::ToString_abi_cxx11_
                  (&local_330,(_anonymous_namespace_ *)&operand_desc,(CapabilitySet *)capabilities,
                   pAVar3);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_330);
        state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        std::__cxx11::string::~string((string *)&local_330);
        DiagnosticStream::~DiagnosticStream(&local_308);
        goto LAB_002ca066;
      }
    }
    state_local._4_4_ =
         OperandVersionExtensionCheck
                   ((ValidationState_t *)inst_local,(Instruction *)which_operand_local,
                    (size_t)operand_local,psStack_60,enabling_capabilities.size_._4_4_);
  }
  else {
    state_local._4_4_ = SPV_SUCCESS;
  }
LAB_002ca066:
  local_6c[1] = 1;
  EnumSet<spv::Capability>::~EnumSet((EnumSet<spv::Capability> *)&operand_desc);
  return state_local._4_4_;
}

Assistant:

spv_result_t CheckRequiredCapabilities(ValidationState_t& state,
                                       const Instruction* inst,
                                       size_t which_operand,
                                       const spv_parsed_operand_t& operand,
                                       uint32_t word) {
  // Mere mention of PointSize, ClipDistance, or CullDistance in a Builtin
  // decoration does not require the associated capability.  The use of such
  // a variable value should trigger the capability requirement, but that's
  // not implemented yet.  This rule is independent of target environment.
  // See https://github.com/KhronosGroup/SPIRV-Tools/issues/365
  if (operand.type == SPV_OPERAND_TYPE_BUILT_IN) {
    switch (spv::BuiltIn(word)) {
      case spv::BuiltIn::PointSize:
      case spv::BuiltIn::ClipDistance:
      case spv::BuiltIn::CullDistance:
        return SPV_SUCCESS;
      default:
        break;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    // Allow all FP rounding modes if requested
    if (state.features().free_fp_rounding_mode) {
      return SPV_SUCCESS;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_GROUP_OPERATION &&
             state.features().group_ops_reduce_and_scans &&
             (word <= uint32_t(spv::GroupOperation::ExclusiveScan))) {
    // Allow certain group operations if requested.
    return SPV_SUCCESS;
  }

  CapabilitySet enabling_capabilities;
  spv_operand_desc operand_desc = nullptr;
  const auto lookup_result =
      state.grammar().lookupOperand(operand.type, word, &operand_desc);
  if (lookup_result == SPV_SUCCESS) {
    // Allow FPRoundingMode decoration if requested.
    if (operand.type == SPV_OPERAND_TYPE_DECORATION &&
        spv::Decoration(operand_desc->value) ==
            spv::Decoration::FPRoundingMode) {
      if (state.features().free_fp_rounding_mode) return SPV_SUCCESS;

      // Vulkan API requires more capabilities on rounding mode.
      if (spvIsVulkanEnv(state.context()->target_env)) {
        enabling_capabilities.insert(
            spv::Capability::StorageUniformBufferBlock16);
        enabling_capabilities.insert(spv::Capability::StorageUniform16);
        enabling_capabilities.insert(spv::Capability::StoragePushConstant16);
        enabling_capabilities.insert(spv::Capability::StorageInputOutput16);
      }
    } else {
      enabling_capabilities = state.grammar().filterCapsAgainstTargetEnv(
          operand_desc->capabilities, operand_desc->numCapabilities);
    }

    // When encountering an OpCapability instruction, the instruction pass
    // registers a capability with the module *before* checking capabilities.
    // So in the case of an OpCapability instruction, don't bother checking
    // enablement by another capability.
    if (inst->opcode() != spv::Op::OpCapability) {
      const bool enabled_by_cap =
          state.HasAnyOfCapabilities(enabling_capabilities);
      if (!enabling_capabilities.empty() && !enabled_by_cap) {
        return state.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
               << "Operand " << which_operand << " of "
               << spvOpcodeString(inst->opcode())
               << " requires one of these capabilities: "
               << ToString(enabling_capabilities, state.grammar());
      }
    }
    return OperandVersionExtensionCheck(state, inst, which_operand,
                                        *operand_desc, word);
  }
  return SPV_SUCCESS;
}